

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O3

void __thiscall utf8_valid_4_bytes_f0_Test::TestBody(utf8_valid_4_bytes_f0_Test *this)

{
  int cu1;
  int cu1_00;
  int cu2;
  uint cu2_00;
  int cu3;
  uint cu3_00;
  
  cu1_00 = 0;
  do {
    cu2_00 = 0;
    do {
      cu3_00 = 0;
      do {
        anon_unknown.dwarf_111e42::assert_is_valid_utf8
                  (((cu2_00 & 0xc0) == 0x80 && cu1_00 - 0x90U < 0x30) && (cu3_00 & 0xc0) == 0x80,4,
                   0xf0,cu1_00,cu2_00,cu3_00);
        cu3_00 = cu3_00 + 1;
      } while (cu3_00 != 0x100);
      cu2_00 = cu2_00 + 1;
    } while (cu2_00 != 0x100);
    cu1_00 = cu1_00 + 1;
  } while (cu1_00 != 0x100);
  return;
}

Assistant:

TEST(utf8, valid_4_bytes_f0) {
  int cu0 = 0xf0;
  FOR_EACH_BYTE(cu1) {
    FOR_EACH_BYTE(cu2) {
      FOR_EACH_BYTE(cu3) {
        bool is_valid = is_in_range(cu1, 0x90, 0xc0) &&
                        is_in_range(cu2, 0x80, 0xc0) &&
                        is_in_range(cu3, 0x80, 0xc0);
        assert_is_valid_utf8(is_valid, 4, cu0, cu1, cu2, cu3);
      }
    }
  }
}